

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,nop_statement_t *stmt)

{
  shared_ptr<tchecker::typed_nop_statement_t> local_28;
  nop_statement_t *local_18;
  nop_statement_t *stmt_local;
  statement_typechecker_t *this_local;
  
  local_18 = stmt;
  stmt_local = (nop_statement_t *)this;
  std::make_shared<tchecker::typed_nop_statement_t,tchecker::statement_type_t>
            ((statement_type_t *)&local_28);
  std::shared_ptr<tchecker::typed_statement_t>::operator=(&this->_typed_stmt,&local_28);
  std::shared_ptr<tchecker::typed_nop_statement_t>::~shared_ptr(&local_28);
  return;
}

Assistant:

virtual void visit(tchecker::nop_statement_t const & stmt)
  {
    _typed_stmt = std::make_shared<tchecker::typed_nop_statement_t>(tchecker::STMT_TYPE_NOP);
  }